

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# panel_code.cpp
# Opt level: O2

void copy_item_to_command_proc(Am_Object *panel_item,Am_Value *value)

{
  bool bVar1;
  Am_Value *in_value;
  Am_Wrapper *value_00;
  Am_Object *this;
  Am_Object command;
  Am_Object owner;
  Am_Object owners_cmd;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object local_30;
  Am_Object local_28;
  
  if (value->type != 0xa001) {
LAB_00246d28:
    bVar1 = Am_Object::Is_Part_Slot(panel_item,0xc5);
    if (bVar1) {
      Am_Object::Remove_Part(panel_item,0xc5);
    }
    Am_Object::Set(panel_item,0xc5,value,1);
    return;
  }
  Am_Object::Am_Object(&command,value);
  bVar1 = Am_Object::Valid(&command);
  if (!bVar1) {
    Am_Object::~Am_Object(&command);
    goto LAB_00246d28;
  }
  Am_Object::Am_Object(&owner,value);
  Am_Object::Am_Object(&local_28,&Am_Command);
  bVar1 = Am_Object::Is_Instance_Of(&owner,&local_28);
  Am_Object::~Am_Object(&local_28);
  Am_Object::~Am_Object(&owner);
  Am_Object::~Am_Object(&command);
  if (!bVar1) goto LAB_00246d28;
  Am_Object::Am_Object(&command,value);
  Am_Object::Get_Owner(&owner,(Am_Slot_Flags)&command);
  bVar1 = Am_Object::operator==(&owner,panel_item);
  if (bVar1) {
    Am_Object::Get_Object(&owners_cmd,(Am_Slot_Key)panel_item,0xc5);
    bVar1 = Am_Object::operator==(&owners_cmd,&command);
    Am_Object::~Am_Object(&owners_cmd);
    if (bVar1) goto LAB_00246e41;
    Am_Object::Am_Object(&local_30,&command);
    Am_Object::Remove_Part(panel_item,&local_30);
    this = &local_30;
LAB_00246dd7:
    Am_Object::~Am_Object(this);
  }
  else {
    bVar1 = Am_Object::Valid(&owner);
    if (bVar1) {
      in_value = Am_Object::Get(&owner,0xa3,7);
      Am_Object::Am_Object(&owners_cmd,in_value);
      bVar1 = Am_Object::operator!=(&owners_cmd,&command);
      if (bVar1) {
        Am_Object::Remove_From_Owner(&command);
      }
      else {
        Am_Object::Create(&local_38,(char *)&command);
        Am_Object::operator=(&command,&local_38);
        Am_Object::~Am_Object(&local_38);
      }
      this = &owners_cmd;
      goto LAB_00246dd7;
    }
  }
  bVar1 = Am_Object::Is_Part_Slot(panel_item,0xc5);
  if (bVar1) {
    Am_Object::Remove_Part(panel_item,0xc5);
  }
  Am_Object::Am_Object(&local_40,&command);
  Am_Object::Set_Part(panel_item,0xc5,&local_40,1);
  Am_Object::~Am_Object(&local_40);
  value_00 = Am_Object::operator_cast_to_Am_Wrapper_(&command);
  Am_Object::Set(panel_item,0x1c6,value_00,1);
LAB_00246e41:
  Am_Object::~Am_Object(&owner);
  Am_Object::~Am_Object(&command);
  return;
}

Assistant:

void
copy_item_to_command_proc(Am_Object &panel_item, const Am_Value &value)
{
  if (value.type == Am_OBJECT && Am_Object(value).Valid() &&
      Am_Object(value).Is_Instance_Of(Am_Command)) {
    // then is a command
    Am_Object command = value;
    Am_Object owner = command.Get_Owner(Am_NO_DEPENDENCY);
    if (owner == panel_item) {
      if (panel_item.Get_Object(Am_COMMAND, Am_NO_DEPENDENCY) == command)
        return; // already fine
      else
        panel_item.Remove_Part(command); // part of me in the wrong slot??
    } else if (owner.Valid()) {
      Am_Object owners_cmd =
          owner.Get(Am_ITEM, Am_NO_DEPENDENCY | Am_RETURN_ZERO_ON_ERROR);
      if (owners_cmd != command) {
        //this can happen when the map re-shuffles the items due to a
        //new one being added or removed.  The map would remove command
        //from owner later.
        // std::cout << "Owner " << owner << " changing item from " << command
        //     << " to " << owners_cmd <<std::endl <<std::flush;
        command.Remove_From_Owner();
      } else // make new instance, leave command where it is
        command = command.Create();
    }
    if (panel_item.Is_Part_Slot(Am_COMMAND)) {
      // prevent deleting the prior command
      panel_item.Remove_Part(Am_COMMAND);
    }
    //Set_Part removes old value if any
    panel_item.Set_Part(Am_COMMAND, command, Am_OK_IF_NOT_THERE);
    panel_item.Set(Am_ATTACHED_COMMAND, command, Am_OK_IF_NOT_THERE);
  } else // not a command object, add to COMMAND slot as a value
  {
    if (panel_item.Is_Part_Slot(Am_COMMAND)) {
      // prevent deleting the prior command
      panel_item.Remove_Part(Am_COMMAND);
    }
    panel_item.Set(Am_COMMAND, value, Am_OK_IF_NOT_THERE);
  }
}